

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

void __thiscall
Js::JavascriptWeakMap::MarkVisitKindSpecificPtrs
          (JavascriptWeakMap *this,SnapshotExtractor *extractor)

{
  bool bVar1;
  ScriptContext *local_20;
  ScriptContext *scriptContext;
  SnapshotExtractor *extractor_local;
  JavascriptWeakMap *this_local;
  
  scriptContext = (ScriptContext *)extractor;
  extractor_local = (SnapshotExtractor *)this;
  local_20 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  bVar1 = ScriptContext::IsTTDReplayModeEnabled(local_20);
  if (bVar1) {
    Map<Js::JavascriptWeakMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor*)::__0>
              (this,(anon_class_8_1_1b6df084)&local_20);
  }
  Map<Js::JavascriptWeakMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor*)::__1>
            (this,(anon_class_8_1_068654c4)&scriptContext);
  return;
}

Assistant:

void JavascriptWeakMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        //All weak things should be reachable from another root so no need to mark but do need to repopulate the pin sets if in replay mode
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            this->Map([&](RecyclableObject* key, Js::Var value)
            {
                scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(key);
            });
        }

        //Keys are weak so are always reachable from somewhere else but values are not so we must walk them
        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            extractor->MarkVisitVar(value);
        });
    }